

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

LPCWSTR __thiscall
Js::ParseableFunctionInfo::GetSourceName<SourceContextInfo*>
          (ParseableFunctionInfo *this,SourceContextInfo **sourceContextInfo)

{
  LPCWSTR pWVar1;
  SourceContextInfo **sourceContextInfo_local;
  ParseableFunctionInfo *this_local;
  
  pWVar1 = GetSourceName<SourceContextInfo*>
                     (sourceContextInfo,(bool)((this->super_FunctionProxy).field_0x47 & 1),
                      (bool)((byte)(this->super_FunctionProxy).field_0x47 >> 1 & 1));
  return pWVar1;
}

Assistant:

LPCWSTR ParseableFunctionInfo::GetSourceName(const T& sourceContextInfo) const
    {
        return GetSourceName<T>(sourceContextInfo, this->m_isEval, this->m_isDynamicFunction);
    }